

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  byte in_CL;
  ushort in_DX;
  ushort in_SI;
  ImFont *in_RDI;
  uint index_size;
  float local_28;
  unsigned_short uVar4;
  int in_stack_ffffffffffffffdc;
  
  uVar1 = (in_RDI->IndexLookup).Size;
  if ((((uVar1 <= in_SI) || ((in_RDI->IndexLookup).Data[in_SI] != 0xffff)) || ((in_CL & 1) != 0)) &&
     ((in_DX < uVar1 || (in_SI < uVar1)))) {
    GrowIndex(in_RDI,in_stack_ffffffffffffffdc);
    if (in_DX < uVar1) {
      uVar4 = (in_RDI->IndexLookup).Data[in_DX];
    }
    else {
      uVar4 = 0xffff;
    }
    puVar2 = ImVector<unsigned_short>::operator[](&in_RDI->IndexLookup,(uint)in_SI);
    *puVar2 = uVar4;
    if (in_DX < uVar1) {
      local_28 = (in_RDI->IndexAdvanceX).Data[in_DX];
    }
    else {
      local_28 = 1.0;
    }
    pfVar3 = ImVector<float>::operator[](&in_RDI->IndexAdvanceX,(uint)in_SI);
    *pfVar3 = local_28;
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}